

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer.cc
# Opt level: O3

bool __thiscall
google::protobuf::util::MessageDifferencer::ShouldCompareNoPresence
          (MessageDifferencer *this,Message *message1,Reflection *reflection1,
          FieldDescriptor *field2)

{
  byte bVar1;
  bool bVar2;
  iterator iVar3;
  Id local_28;
  
  if ((this->force_compare_no_presence_ == true) &&
     (bVar2 = FieldDescriptor::has_presence(field2), !bVar2)) {
    bVar1 = field2->field_0x1;
    if (0xbf < bVar1 != (bool)((bVar1 & 0x20) >> 5)) goto LAB_002c30c3;
    if ((bVar1 & 0x20) == 0) {
      return true;
    }
  }
  bVar1 = field2->field_0x1;
  if (0xbf < bVar1 == (bool)((bVar1 & 0x20) >> 5)) {
    if ((((bVar1 & 0x20) == 0) && (bVar2 = FieldDescriptor::has_presence(field2), !bVar2)) &&
       (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field2->type_ * 4) - 1U < 9)) {
      local_28 = TextFormat::Parser::UnsetFieldsMetadata::GetUnsetFieldId(message1,field2);
      iVar3 = absl::lts_20250127::container_internal::
              raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,absl::lts_20250127::hash_internal::Hash<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,std::equal_to<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,std::allocator<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>>
              ::
              find<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>
                        ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,absl::lts_20250127::hash_internal::Hash<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,std::equal_to<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,std::allocator<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>>
                          *)&this->require_no_presence_fields_,&local_28);
      absl::lts_20250127::container_internal::
      raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
      ::AssertNotDebugCapacity
                ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
                  *)&this->require_no_presence_fields_);
      return iVar3.ctrl_ != (ctrl_t *)0x0;
    }
    return false;
  }
  ShouldCompareNoPresence();
LAB_002c30c3:
  ShouldCompareNoPresence();
}

Assistant:

bool MessageDifferencer::ShouldCompareNoPresence(
    const Message& message1, const Reflection& reflection1,
    const FieldDescriptor* field2) const {
  const bool compare_no_presence_by_field = force_compare_no_presence_ &&
                                            !field2->has_presence() &&
                                            !field2->is_repeated();
  if (compare_no_presence_by_field) {
    return true;
  }
  const bool compare_no_presence_by_address =
      !field2->is_repeated() && !field2->has_presence() &&
      ValidMissingField(*field2) &&
      require_no_presence_fields_.ids_.contains(
          TextFormat::Parser::UnsetFieldsMetadata::GetUnsetFieldId(message1,
                                                                   *field2));
  return compare_no_presence_by_address;
}